

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  int *piVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  uint uVar10;
  int iVar11;
  CURLofft CVar12;
  char *pcVar13;
  size_t sVar14;
  size_t __n;
  Curl_easy *pCVar15;
  ulong uVar16;
  byte *ptr;
  char *pcVar17;
  int imapcode;
  curl_off_t size;
  size_t nread;
  int local_6c;
  size_t local_68 [3];
  size_t local_50;
  ulong local_48;
  SASL *local_40;
  char *local_38;
  
  sockfd = conn->sock[0];
  local_50 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar9 = imap_perform_upgrade_tls(conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar9;
  }
  local_40 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&local_6c,&local_50);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (local_6c == -1) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (local_6c == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (local_6c != 1) {
        pCVar15 = conn->data;
        if (local_6c != 3) {
          Curl_failf(pCVar15,"Got unexpected imap-server response");
          CVar9 = CURLE_WEIRD_SERVER_REPLY;
          break;
        }
        (conn->proto).imapc.preauth = true;
        Curl_infof(pCVar15,"PREAUTH connection, already authenticated!\n");
      }
      (conn->proto).ftpc.diralloc = 0;
      *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
      (conn->proto).imapc.tls_supported = false;
      CVar9 = imap_sendf(conn,"CAPABILITY");
      if (CVar9 == CURLE_OK) {
        (conn->proto).imapc.state = IMAP_CAPABILITY;
      }
      break;
    case IMAP_CAPABILITY:
      pCVar15 = conn->data;
      if (local_6c == 1) {
        cVar3 = (pCVar15->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).imapc.tls_supported == true) {
            CVar9 = imap_sendf(conn,"STARTTLS");
            if (CVar9 == CURLE_OK) {
              (conn->proto).imapc.state = IMAP_STARTTLS;
            }
            break;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            pcVar13 = "STARTTLS not supported.";
            goto LAB_0013386f;
          }
        }
LAB_001338b2:
        CVar9 = imap_perform_authentication(conn);
        break;
      }
      if (local_6c != 0x2a) goto LAB_001338b2;
      ptr = (byte *)((pCVar15->state).buffer + 2);
LAB_001335d9:
      do {
        uVar16 = (ulong)*ptr;
        if (uVar16 < 0x21) {
          if ((0x100002600U >> (uVar16 & 0x3f) & 1) != 0) {
            ptr = ptr + 1;
            goto LAB_001335d9;
          }
          if (uVar16 != 0) goto LAB_00133604;
          bVar6 = false;
        }
        else {
LAB_00133604:
          uVar16 = 0;
          while ((0x20 < (ulong)ptr[uVar16] ||
                 ((0x100002601U >> ((ulong)ptr[uVar16] & 0x3f) & 1) == 0))) {
            uVar16 = uVar16 + 1;
          }
          if (uVar16 == 7) {
            if (*(int *)(ptr + 3) != 0x52492d4c || *(int *)ptr != 0x4c534153) goto LAB_001336a1;
            (conn->proto).imapc.ir_supported = true;
            sVar14 = 7;
          }
          else if (uVar16 == 0xd) {
            if (*(long *)(ptr + 5) != 0x44454c4241534944 || *(long *)ptr != 0x5349444e49474f4c)
            goto LAB_001336a1;
            (conn->proto).imapc.login_disabled = true;
            sVar14 = 0xd;
          }
          else if ((uVar16 == 8) && (*(long *)ptr == 0x534c545452415453)) {
            (conn->proto).imapc.tls_supported = true;
            sVar14 = 8;
          }
          else {
LAB_001336a1:
            sVar14 = uVar16;
            if ((5 < uVar16) && (ptr[4] == 0x3d && *(int *)ptr == 0x48545541)) {
              ptr = ptr + 5;
              sVar14 = uVar16 - 5;
              uVar10 = Curl_sasl_decode_mech((char *)ptr,sVar14,local_68);
              if ((uVar10 != 0) && (local_68[0] + 5 == uVar16)) {
                piVar1 = &(conn->proto).ftpc.diralloc;
                *piVar1 = *piVar1 | uVar10;
              }
            }
          }
          ptr = ptr + sVar14;
          bVar6 = true;
        }
      } while (bVar6);
      goto LAB_0013381b;
    case IMAP_STARTTLS:
      if (local_6c == 1) {
        CVar9 = imap_perform_upgrade_tls(conn);
      }
      else {
        pCVar15 = conn->data;
        if ((pCVar15->set).use_ssl == CURLUSESSL_TRY) goto LAB_001338b2;
        pcVar13 = "STARTTLS denied";
LAB_0013386f:
        Curl_failf(pCVar15,pcVar13);
        CVar9 = CURLE_USE_SSL_FAILED;
      }
      break;
    default:
      goto switchD_001334cd_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar15 = conn->data;
      CVar9 = Curl_sasl_continue(local_40,conn,local_6c,(saslprogress *)local_68);
      if (CVar9 == CURLE_OK) {
        if ((saslprogress)local_68[0] == SASL_IDLE) {
          if (((conn->proto).imapc.login_disabled == false) &&
             (((conn->proto).ftpc.cwdfail & 1U) != 0)) {
            CVar9 = imap_perform_login(conn);
          }
          else {
            Curl_failf(pCVar15,"Authentication cancelled");
            CVar9 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar9 = CURLE_OK;
          if ((saslprogress)local_68[0] == SASL_DONE) goto LAB_0013399f;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_6c == 1) goto switchD_001334cd_caseD_4;
      Curl_failf(conn->data,"Access denied. %c");
LAB_0013393b:
      CVar9 = CURLE_LOGIN_DENIED;
      break;
    case IMAP_LIST:
    case IMAP_SEARCH:
      CVar9 = imap_state_listsearch_resp(conn,local_6c,local_6c);
      break;
    case IMAP_SELECT:
      pCVar15 = conn->data;
      if (local_6c != 1) {
        if (local_6c == 0x2a) {
          iVar11 = __isoc99_sscanf((pCVar15->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                   local_68);
          if (iVar11 == 1) {
            (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
            (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
            pcVar13 = (*Curl_cstrdup)((char *)local_68);
            (conn->proto).imapc.mailbox_uidvalidity = pcVar13;
          }
          goto LAB_0013381b;
        }
        Curl_failf(pCVar15,"Select failed");
        goto LAB_0013393b;
      }
      pvVar4 = (pCVar15->req).protop;
      if (((*(char **)((long)pvVar4 + 0x10) == (char *)0x0) ||
          (pcVar13 = (conn->proto).imapc.mailbox_uidvalidity, pcVar13 == (char *)0x0)) ||
         (iVar11 = Curl_strcasecompare(*(char **)((long)pvVar4 + 0x10),pcVar13), iVar11 != 0)) {
        pcVar13 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
        (conn->proto).imapc.mailbox = pcVar13;
        if (*(long *)((long)pvVar4 + 0x40) == 0) {
          if (*(long *)((long)pvVar4 + 0x38) == 0) {
            CVar9 = imap_perform_fetch(conn);
          }
          else {
            CVar9 = imap_perform_search(conn);
          }
        }
        else {
          CVar9 = imap_perform_list(conn);
        }
      }
      else {
        Curl_failf(conn->data,"Mailbox UIDVALIDITY has changed");
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
      break;
    case IMAP_FETCH:
      pCVar15 = conn->data;
      pcVar13 = (pCVar15->state).buffer;
      local_68[0] = 0;
      pcVar17 = pcVar13;
      if (local_6c == 0x2a) {
        while( true ) {
          if (*pcVar13 == '\0') break;
          if (*pcVar13 == '{') {
            CVar12 = curlx_strtoofft(pcVar13 + 1,&local_38,10,(curl_off_t *)local_68);
            if ((((CVar12 == CURL_OFFT_OK) && (1 < (long)local_38 - (long)pcVar17)) &&
                (*local_38 == '}')) && ((local_38[1] == '\r' && (local_38[2] == '\0')))) {
              CVar9 = CURLE_OK;
              Curl_infof(pCVar15,"Found %ld bytes to download\n",local_68[0]);
              Curl_pgrsSetDownloadSize(pCVar15,local_68[0]);
              pcVar13 = (pp->ftpc).pp.cache;
              if (pcVar13 != (char *)0x0) {
                uVar16 = (conn->proto).ftpc.pp.cache_size;
                sVar14 = local_68[0];
                if (uVar16 < local_68[0]) {
                  sVar14 = uVar16;
                }
                if (sVar14 == 0) {
                  (conn->proto).imapc.state = IMAP_STOP;
                  CVar9 = CURLE_OK;
LAB_00133b13:
                  bVar6 = false;
                }
                else {
                  local_48 = sVar14;
                  CVar9 = Curl_client_write(conn,1,pcVar13,sVar14);
                  uVar16 = local_48;
                  if (CVar9 != CURLE_OK) goto LAB_00133b13;
                  pcVar2 = &(pCVar15->req).bytecount;
                  *pcVar2 = *pcVar2 + local_48;
                  Curl_infof(pCVar15,"Written %zu bytes, %lu bytes are left for transfer\n",local_48
                            );
                  uVar7 = local_48;
                  uVar5 = (conn->proto).ftpc.pp.cache_size;
                  __n = uVar5 - uVar16;
                  if (uVar5 < uVar16 || __n == 0) {
                    (*Curl_cfree)((pp->ftpc).pp.cache);
                    (pp->ftpc).pp.cache = (char *)0x0;
                    sVar14 = 0;
                  }
                  else {
                    memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + local_48),
                            __n);
                    sVar14 = (conn->proto).ftpc.pp.cache_size - uVar7;
                  }
                  (conn->proto).ftpc.pp.cache_size = sVar14;
                  bVar6 = true;
                  CVar9 = CURLE_OK;
                }
                if (!bVar6) goto LAB_001339ae;
              }
              if ((pCVar15->req).bytecount == local_68[0]) {
                iVar11 = -1;
                uVar16 = 0xffffffffffffffff;
              }
              else {
                (pCVar15->req).maxdownload = local_68[0];
                iVar11 = 0;
                uVar16 = local_68[0];
              }
              Curl_setup_transfer(conn,iVar11,uVar16,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              goto LAB_0013399f;
            }
            break;
          }
          pcVar13 = pcVar13 + 1;
          pcVar17 = pcVar17 + 1;
        }
        Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
        CVar9 = CURLE_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar15,-1);
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_0013399f:
      (conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      CVar9 = CURLE_WEIRD_SERVER_REPLY;
      goto LAB_00133808;
    case IMAP_APPEND:
      CVar9 = CURLE_UPLOAD_FAILED;
      if (local_6c == 0x2b) {
        Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
        CVar9 = CURLE_OK;
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
        (conn->proto).imapc.state = IMAP_STOP;
      }
      break;
    case IMAP_APPEND_FINAL:
      CVar9 = CURLE_UPLOAD_FAILED;
LAB_00133808:
      if (local_6c == 1) {
switchD_001334cd_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
LAB_0013381b:
        CVar9 = CURLE_OK;
      }
    }
LAB_001339ae:
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}